

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  ostream *poVar4;
  int errcode;
  int errcode_00;
  int errcode_01;
  RTPTime RStack_10a48;
  RTPTime RStack_10a40;
  RTPTime RStack_10a38;
  RTPTime t;
  RTPPacket *packet;
  byte bStack_10a01;
  RTPTime RStack_10a00;
  bool done;
  RTPTime starttime;
  RTPTime delay;
  undefined1 auStack_109e8 [4];
  int i;
  uint8_t silencebuffer [160];
  undefined1 auStack_10928 [8];
  RTPIPv4Address addr;
  undefined1 auStack_10908 [4];
  uint8_t localip [4];
  undefined1 auStack_108e0 [4];
  int status;
  RTPUDPv4TransmissionParams transparams;
  undefined1 auStack_10870 [8];
  RTPSessionParams sessionparams;
  RTPSession session;
  
  jrtplib::RTPSession::RTPSession
            ((RTPSession *)&sessionparams.m_needThreadSafety,(RTPRandom *)0x0,
             (RTPMemoryManager *)0x0);
  jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)auStack_10870);
  jrtplib::RTPSessionParams::SetOwnTimestampUnit((RTPSessionParams *)auStack_10870,0.000125);
  jrtplib::RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams
            ((RTPUDPv4TransmissionParams *)auStack_108e0);
  jrtplib::RTPUDPv4TransmissionParams::SetPortbase((RTPUDPv4TransmissionParams *)auStack_108e0,8000)
  ;
  uVar2 = jrtplib::RTPSession::Create
                    ((RTPSession *)&sessionparams.m_needThreadSafety,
                     (RTPSessionParams *)auStack_10870,(RTPTransmissionParams *)auStack_108e0,
                     IPv4UDPProto);
  if ((int)uVar2 < 0) {
    jrtplib::RTPGetErrorString_abi_cxx11_((string *)auStack_10908,(jrtplib *)(ulong)uVar2,errcode);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)auStack_10908);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)auStack_10908);
    exit(-1);
  }
  addr._20_4_ = 0x100007f;
  jrtplib::RTPIPv4Address::RTPIPv4Address
            ((RTPIPv4Address *)auStack_10928,&addr.field_0x14,9000,false);
  uVar2 = jrtplib::RTPSession::AddDestination
                    ((RTPSession *)&sessionparams.m_needThreadSafety,(RTPAddress *)auStack_10928);
  if (-1 < (int)uVar2) {
    jrtplib::RTPSession::SetDefaultPayloadType((RTPSession *)&sessionparams.m_needThreadSafety,'`');
    jrtplib::RTPSession::SetDefaultMark((RTPSession *)&sessionparams.m_needThreadSafety,false);
    jrtplib::RTPSession::SetDefaultTimestampIncrement
              ((RTPSession *)&sessionparams.m_needThreadSafety,0xa0);
    for (delay.m_t._4_4_ = 0; delay.m_t._4_4_ < 0xa0; delay.m_t._4_4_ = delay.m_t._4_4_ + 1) {
      auStack_109e8[delay.m_t._4_4_] = 0x80;
    }
    jrtplib::RTPTime::RTPTime(&starttime,0.02);
    RStack_10a00 = jrtplib::RTPTime::CurrentTime();
    bStack_10a01 = 0;
    while( true ) {
      if (((bStack_10a01 ^ 0xff) & 1) == 0) {
        jrtplib::RTPTime::RTPTime(&RStack_10a48,10.0);
        starttime.m_t = RStack_10a48.m_t;
        jrtplib::RTPSession::BYEDestroy
                  ((RTPSession *)&sessionparams.m_needThreadSafety,&starttime,"Time\'s up",9);
        jrtplib::RTPIPv4Address::~RTPIPv4Address((RTPIPv4Address *)auStack_10928);
        jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams
                  ((RTPUDPv4TransmissionParams *)auStack_108e0);
        jrtplib::RTPSessionParams::~RTPSessionParams((RTPSessionParams *)auStack_10870);
        jrtplib::RTPSession::~RTPSession((RTPSession *)&sessionparams.m_needThreadSafety);
        return 0;
      }
      uVar2 = jrtplib::RTPSession::SendPacket
                        ((RTPSession *)&sessionparams.m_needThreadSafety,auStack_109e8,0xa0);
      if ((int)uVar2 < 0) break;
      jrtplib::RTPSession::BeginDataAccess((RTPSession *)&sessionparams.m_needThreadSafety);
      bVar1 = jrtplib::RTPSession::GotoFirstSource((RTPSession *)&sessionparams.m_needThreadSafety);
      if (bVar1) {
        do {
          while (t.m_t = (double)jrtplib::RTPSession::GetNextPacket
                                           ((RTPSession *)&sessionparams.m_needThreadSafety),
                (RTPPacket *)t.m_t != (RTPPacket *)0x0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Got packet with ");
            poVar4 = std::operator<<(poVar4,"extended sequence number ");
            uVar3 = jrtplib::RTPPacket::GetExtendedSequenceNumber((RTPPacket *)t.m_t);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
            poVar4 = std::operator<<(poVar4," from SSRC ");
            uVar3 = jrtplib::RTPPacket::GetSSRC((RTPPacket *)t.m_t);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            jrtplib::RTPSession::DeletePacket
                      ((RTPSession *)&sessionparams.m_needThreadSafety,(RTPPacket *)t.m_t);
          }
          bVar1 = jrtplib::RTPSession::GotoNextSource
                            ((RTPSession *)&sessionparams.m_needThreadSafety);
        } while (bVar1);
      }
      jrtplib::RTPSession::EndDataAccess((RTPSession *)&sessionparams.m_needThreadSafety);
      jrtplib::RTPTime::Wait(&starttime);
      RStack_10a38 = jrtplib::RTPTime::CurrentTime();
      jrtplib::RTPTime::operator-=(&RStack_10a38,&stack0xfffffffffffef600);
      jrtplib::RTPTime::RTPTime(&RStack_10a40,60.0);
      bVar1 = jrtplib::RTPTime::operator>(&RStack_10a38,&RStack_10a40);
      if (bVar1) {
        bStack_10a01 = 1;
      }
    }
    jrtplib::RTPGetErrorString_abi_cxx11_((string *)&packet,(jrtplib *)(ulong)uVar2,errcode_01);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&packet);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&packet);
    exit(-1);
  }
  jrtplib::RTPGetErrorString_abi_cxx11_
            ((string *)(silencebuffer + 0x98),(jrtplib *)(ulong)uVar2,errcode_00);
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)(silencebuffer + 0x98));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(silencebuffer + 0x98));
  exit(-1);
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
		
	RTPSession session;
	
	RTPSessionParams sessionparams;
	sessionparams.SetOwnTimestampUnit(1.0/8000.0);
			
	RTPUDPv4TransmissionParams transparams;
	transparams.SetPortbase(8000);
			
	int status = session.Create(sessionparams,&transparams);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	uint8_t localip[]={127,0,0,1};
	RTPIPv4Address addr(localip,9000);
	
	status = session.AddDestination(addr);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	session.SetDefaultPayloadType(96);
	session.SetDefaultMark(false);
	session.SetDefaultTimestampIncrement(160);
	
	uint8_t silencebuffer[160];
	for (int i = 0 ; i < 160 ; i++)
		silencebuffer[i] = 128;

	RTPTime delay(0.020);
	RTPTime starttime = RTPTime::CurrentTime();
	
	bool done = false;
	while (!done)
	{
		status = session.SendPacket(silencebuffer,160);
		if (status < 0)
		{
			std::cerr << RTPGetErrorString(status) << std::endl;
			exit(-1);
		}
		
		session.BeginDataAccess();
		if (session.GotoFirstSource())
		{
			do
			{
				RTPPacket *packet;

				while ((packet = session.GetNextPacket()) != 0)
				{
					std::cout << "Got packet with " 
					          << "extended sequence number " 
					          << packet->GetExtendedSequenceNumber() 
					          << " from SSRC " << packet->GetSSRC() 
					          << std::endl;
					session.DeletePacket(packet);
				}
			} while (session.GotoNextSource());
		}
		session.EndDataAccess();
			
		RTPTime::Wait(delay);
		
		RTPTime t = RTPTime::CurrentTime();
		t -= starttime;
		if (t > RTPTime(60.0))
			done = true;
	}
	
	delay = RTPTime(10.0);
	session.BYEDestroy(delay,"Time's up",9);
	
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}